

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O1

exr_result_t
exr_attr_chlist_add(exr_context_t ctxt,exr_attr_chlist_t *clist,char *name,exr_pixel_type_t ptype,
                   exr_perceptual_treatment_t islinear,int32_t xsamp,int32_t ysamp)

{
  exr_result_t eVar1;
  size_t sVar2;
  int32_t namelen;
  
  if (name == (char *)0x0) {
    namelen = 0;
  }
  else {
    sVar2 = strlen(name);
    namelen = (int32_t)sVar2;
  }
  eVar1 = exr_attr_chlist_add_with_length(ctxt,clist,name,namelen,ptype,islinear,xsamp,ysamp);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_chlist_add (
    exr_context_t              ctxt,
    exr_attr_chlist_t*         clist,
    const char*                name,
    exr_pixel_type_t           ptype,
    exr_perceptual_treatment_t islinear,
    int32_t                    xsamp,
    int32_t                    ysamp)
{
    int32_t len = 0;
    if (name) len = (int32_t) strlen (name);
    return exr_attr_chlist_add_with_length (
        ctxt, clist, name, len, ptype, islinear, xsamp, ysamp);
}